

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
        *this)

{
  bool bVar1;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  *this_local;
  
  bVar1 = empty(this);
  if (!bVar1) {
    if (this->capacity_ != 0) {
      this->size_ = 0;
      reset_ctrl(this,this->capacity_);
      reset_growth_left(this,this->capacity_);
    }
    bVar1 = empty(this);
    if (!bVar1) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                    ,0x50a,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<int, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const int, int>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<int, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const int, int>>]"
                   );
    }
    HashtablezInfoHandle::RecordStorageChanged
              ((HashtablezInfoHandle *)&this->field_0x20,0,this->capacity_);
  }
  return;
}

Assistant:

PHMAP_ATTRIBUTE_REINITIALIZES void clear() {
        if (empty())
            return;
        if (capacity_) {
           PHMAP_IF_CONSTEXPR((!std::is_trivially_destructible<typename PolicyTraits::value_type>::value ||
                               std::is_same<typename Policy::is_flat, std::false_type>::value)) {
                // node map or not trivially destructible... we  need to iterate and destroy values one by one
                for (size_t i = 0; i != capacity_; ++i) {
                    if (IsFull(ctrl_[i])) {
                        PolicyTraits::destroy(&alloc_ref(), slots_ + i);
                    }
                }
            }
            size_ = 0;
            reset_ctrl(capacity_);
            reset_growth_left(capacity_);
        }
        assert(empty());
        infoz_.RecordStorageChanged(0, capacity_);
    }